

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

void strcpy_url(char *output,char *url,_Bool relative)

{
  bool bVar1;
  _Bool _Var2;
  char *local_38;
  uchar *host_sep;
  char *optr;
  uchar *iptr;
  _Bool left;
  _Bool relative_local;
  char *url_local;
  char *output_local;
  
  bVar1 = true;
  host_sep = (uchar *)output;
  optr = url;
  local_38 = url;
  if (!relative) {
    local_38 = find_host_sep(url);
  }
  for (; *optr != '\0'; optr = optr + 1) {
    if (optr < local_38) {
      *host_sep = *optr;
      host_sep = host_sep + 1;
    }
    else if (*optr == ' ') {
      if (bVar1) {
        *host_sep = '%';
        host_sep[1] = '2';
        host_sep[2] = '0';
        host_sep = host_sep + 3;
      }
      else {
        *host_sep = '+';
        host_sep = host_sep + 1;
      }
    }
    else {
      if (*optr == '?') {
        bVar1 = false;
      }
      _Var2 = urlchar_needs_escaping((uint)(byte)*optr);
      if (_Var2) {
        curl_msnprintf((char *)host_sep,4,"%%%02x",(ulong)(byte)*optr);
        host_sep = host_sep + 3;
      }
      else {
        *host_sep = *optr;
        host_sep = host_sep + 1;
      }
    }
  }
  *host_sep = '\0';
  return;
}

Assistant:

static void strcpy_url(char *output, const char *url, bool relative)
{
  /* we must add this with whitespace-replacing */
  bool left = TRUE;
  const unsigned char *iptr;
  char *optr = output;
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      *iptr;         /* until zero byte */
      iptr++) {

    if(iptr < host_sep) {
      *optr++ = *iptr;
      continue;
    }

    switch(*iptr) {
    case '?':
      left = FALSE;
      /* FALLTHROUGH */
    default:
      if(urlchar_needs_escaping(*iptr)) {
        msnprintf(optr, 4, "%%%02x", *iptr);
        optr += 3;
      }
      else
        *optr++=*iptr;
      break;
    case ' ':
      if(left) {
        *optr++='%'; /* add a '%' */
        *optr++='2'; /* add a '2' */
        *optr++='0'; /* add a '0' */
      }
      else
        *optr++='+'; /* add a '+' here */
      break;
    }
  }
  *optr = 0; /* null-terminate output buffer */

}